

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  istream *piVar7;
  size_t sVar8;
  runtime_error *this_00;
  undefined8 uVar9;
  long *plVar10;
  undefined1 local_698 [8];
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  socket;
  query query;
  resolver resolver;
  ostream request_stream;
  undefined1 local_330 [8];
  streambuf request;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  undefined1 auStack_2b8 [8];
  streambuf response;
  string status_message;
  context context;
  string http_version;
  istream response_stream;
  ios_base local_1f0 [16];
  byte abStack_1e0 [248];
  size_type *local_e8;
  string path;
  long local_c0;
  size_type *local_b8;
  string parameters;
  string server;
  io_service io_service;
  undefined1 auStack_60 [4];
  uint status_code;
  string header;
  error_code ec;
  
  this = _response_stream;
  parameters.field_2._8_8_ = &server._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parameters.field_2 + 8),"www.instagram.com","");
  local_e8 = &path._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"/accounts/login/ajax/","");
  local_b8 = &parameters._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"username=fewfw&password=fewfw","");
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            ((basic_streambuf<std::allocator<char>_> *)local_330,0xffffffffffffffff,
             (allocator<char> *)local_698);
  std::ostream::ostream(&resolver.impl_.executor_.prop_fns_,(streambuf *)local_330);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"POST ",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&resolver.impl_.executor_.prop_fns_,(char *)local_e8,
                      (long)path._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," HTTP/1.1\r\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Host: ",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&resolver.impl_.executor_.prop_fns_,
                      (char *)parameters.field_2._8_8_,(long)server._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Accept: */*\r\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,
             "X-CSRFToken: fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY\r\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Referer: https://",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&resolver.impl_.executor_.prop_fns_,
                      (char *)parameters.field_2._8_8_,(long)server._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/\r\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Content-Length: ",0x10);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&resolver.impl_.executor_.prop_fns_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,
             "Cookie: csrftoken=fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY; mid=V-I19wAEAAG8pOV3FUjiNYJVw2Z-; ig_pr=2; ig_vw=1440\r\n"
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,"Connection: close\r\n\r\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&resolver.impl_.executor_.prop_fns_,(char *)local_b8,
             (long)parameters._M_dataplus._M_p);
  boost::asio::ssl::context::context((context *)((long)&status_message.field_2 + 8),sslv23);
  boost::asio::ssl::context::set_default_verify_paths
            ((context *)((long)&status_message.field_2 + 8));
  boost::asio::io_context::io_context((io_context *)((long)&server.field_2 + 8));
  boost::system::error_code::error_code((error_code *)((long)&header.field_2 + 8));
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::stream<boost::asio::io_context&>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)local_698,(io_context *)((long)&server.field_2 + 8),
             (context *)((long)&status_message.field_2 + 8));
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)((long)&query.service_name_.field_2 + 8),(io_context *)((long)&server.field_2 + 8),
             (type *)0x0);
  http_version.field_2._8_8_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&http_version.field_2 + 8),"https","");
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)&socket.core_.input_.size_,
             (string *)((long)&parameters.field_2 + 8),(string *)((long)&http_version.field_2 + 8),
             address_configured);
  if ((ios_base *)http_version.field_2._8_8_ != local_1f0) {
    operator_delete((void *)http_version.field_2._8_8_);
  }
  boost::asio::detail::resolver_service<boost::asio::ip::tcp>::resolve
            ((results_type *)((long)&http_version.field_2 + 8),
             (resolver_service<boost::asio::ip::tcp> *)query.service_name_.field_2._8_8_,
             (implementation_type *)&resolver,(query_type *)&socket.core_.input_.size_,
             (error_code *)((long)&header.field_2 + 8));
  uVar9 = http_version.field_2._8_8_;
  if (header.field_2._M_local_buf[0xc] == '\x01') {
    (**(code **)(*(long *)ec._0_8_ + 0x20))
              ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,header.field_2._8_4_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                        (long)_response_stream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
LAB_00122fe3:
    if ((ios_base *)http_version.field_2._8_8_ != local_1f0) {
      operator_delete((void *)http_version.field_2._8_8_);
    }
    iVar4 = -1;
    bVar2 = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resolve OK",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::set_verify_mode((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_698,1,(error_code *)((long)&header.field_2 + 8));
    if (header.field_2._M_local_buf[0xc] == '\x01') {
      (**(code **)(*(long *)ec._0_8_ + 0x20))
                ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,header.field_2._8_4_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                          (long)_response_stream);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      goto LAB_00122fe3;
    }
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
    ::
    set_verify_callback<boost::_bi::bind_t<bool,bool(*)(bool,boost::asio::ssl::verify_context&),boost::_bi::list2<boost::arg<1>,boost::arg<2>>>>
              ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                *)local_698,_local_698,(error_code *)verify_certificate);
    if (header.field_2._M_local_buf[0xc] == '\x01') {
      (**(code **)(*(long *)ec._0_8_ + 0x20))
                ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,header.field_2._8_4_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                          (long)_response_stream);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      goto LAB_00122fe3;
    }
    if (_response_stream == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _response_stream = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        _response_stream->_M_use_count = _response_stream->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded == '\0') {
          LOCK();
          _response_stream->_M_use_count = _response_stream->_M_use_count + 1;
          UNLOCK();
          goto LAB_00122cda;
        }
      }
      else {
        _response_stream->_M_use_count = _response_stream->_M_use_count + 1;
      }
      _response_stream->_M_use_count = _response_stream->_M_use_count + 1;
    }
LAB_00122cda:
    auStack_2b8 = (undefined1  [8])0x0;
    response.super_streambuf = (streambuf)0x0;
    response._1_7_ = 0;
    response._8_8_ = 0;
    http_version.field_2._8_8_ = uVar9;
    boost::asio::
    connect<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,boost::asio::detail::default_connect_condition>
              (&request.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(asio *)local_698);
    if (response._0_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)response._0_8_);
    }
    if (_response_stream != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_response_stream);
    }
    if (local_2c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8);
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (header.field_2._M_local_buf[0xc] == '\x01') {
      (**(code **)(*(long *)ec._0_8_ + 0x20))
                ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,header.field_2._8_4_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                          (long)_response_stream);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      goto LAB_00122fe3;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Connect OK",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    http_version.field_2._8_8_ = http_version.field_2._8_8_ & 0xffffffff00000000;
    boost::asio::ssl::detail::
    io<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::ssl::detail::handshake_op>
              ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)local_698,
               (stream_core *)
               &socket.next_layer_.
                super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                .impl_.executor_.prop_fns_,(handshake_op *)((long)&http_version.field_2 + 8),
               (error_code *)((long)&header.field_2 + 8));
    if (header.field_2._M_local_buf[0xc] == '\x01') {
      (**(code **)(*(long *)ec._0_8_ + 0x20))
                ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,header.field_2._8_4_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                          (long)_response_stream);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      goto LAB_00122fe3;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Handshake OK",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Print request:",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n****************************************\n",0x2a);
    if (request._8_8_ == 0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13e368);
    }
    else {
      sVar6 = strlen((char *)request._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)request._8_8_,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n****************************************",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    http_version.field_2._8_8_ = local_330;
    boost::asio::
    write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_all_t>
              (local_698,(undefined1 *)((long)&http_version.field_2 + 8),
               (undefined1 *)((long)&header.field_2 + 8),0);
    if (header.field_2._M_local_buf[0xc] == '\x01') {
      (**(code **)(*(long *)ec._0_8_ + 0x20))
                ((undefined1 *)((long)&http_version.field_2 + 8),ec._0_8_,header.field_2._8_4_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)http_version.field_2._8_8_,
                          (long)_response_stream);
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_00122fe3;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Write OK",8);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
              ((basic_streambuf<std::allocator<char>_> *)auStack_2b8,0xffffffffffffffff,
               (allocator<char> *)(http_version.field_2._M_local_buf + 8));
    http_version.field_2._8_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&http_version.field_2 + 8),"\r\n","");
    boost::asio::
    read_until<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
              ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                *)local_698,(basic_streambuf<std::allocator<char>_> *)auStack_2b8,
               (string *)((long)&http_version.field_2 + 8));
    if ((ios_base *)http_version.field_2._8_8_ != local_1f0) {
      operator_delete((void *)http_version.field_2._8_8_);
    }
    std::istream::istream
              ((istream *)(http_version.field_2._M_local_buf + 8),(streambuf *)auStack_2b8);
    context.init_.ref_.
    super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&http_version._M_string_length;
    http_version._M_dataplus._M_p = (pointer)0x0;
    http_version._M_string_length._0_1_ = 0;
    std::operator>>((istream *)(http_version.field_2._M_local_buf + 8),
                    (string *)
                    &context.init_.ref_.
                     super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
    std::istream::_M_extract<unsigned_int>((uint *)(http_version.field_2._M_local_buf + 8));
    response.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)&status_message._M_string_length;
    status_message._M_dataplus._M_p = (pointer)0x0;
    status_message._M_string_length._0_1_ = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(http_version.field_2._M_local_buf + 8),
               (string *)
               &response.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((abStack_1e0[*(long *)(http_version.field_2._8_8_ + -0x18)] & 5) == 0) {
      std::__cxx11::string::substr
                ((ulong)auStack_60,
                 (ulong)&context.init_.ref_.
                         super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
      iVar4 = std::__cxx11::string::compare((char *)auStack_60);
      if ((size_type *)_auStack_60 != &header._M_string_length) {
        operator_delete(_auStack_60);
      }
      if (iVar4 != 0) goto LAB_001232ce;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Response returned with status code ",0x23);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar5);
      _auStack_60 = (pointer)&header._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_60,"\r\n\r\n","");
      boost::asio::
      read_until<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                  *)local_698,(basic_streambuf<std::allocator<char>_> *)auStack_2b8,
                 (string *)auStack_60);
      if ((size_type *)_auStack_60 != &header._M_string_length) {
        operator_delete(_auStack_60);
      }
      _auStack_60 = (pointer)&header._M_string_length;
      header._M_dataplus._M_p = (pointer)0x0;
      header._M_string_length._0_1_ = 0;
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(http_version.field_2._8_8_ + -0x18));
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)(http_version.field_2._M_local_buf + 8),(string *)auStack_60,
                            cVar3);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        iVar4 = std::__cxx11::string::compare((char *)auStack_60);
        if (iVar4 == 0) break;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,_auStack_60,(long)header._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      if (response._32_8_ != response._8_8_) {
        std::ostream::operator<<(&std::cout,(streambuf *)auStack_2b8);
      }
      while( true ) {
        path.field_2._8_8_ = auStack_2b8;
        sVar8 = boost::asio::
                read<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_at_least_t>
                          ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                            *)local_698,
                           (basic_streambuf_ref<std::allocator<char>_> *)((long)&path.field_2 + 8),
                           (transfer_at_least_t)0x1,(error_code *)((long)&header.field_2 + 8),
                           (type *)0x0);
        if (sVar8 == 0) break;
        std::ostream::operator<<(&std::cout,(streambuf *)auStack_2b8);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      boost::system::error_code::error_code<boost::asio::error::misc_errors>
                ((error_code *)((long)&path.field_2 + 8),eof,(type *)0x0);
      if (header.field_2._8_4_ != path.field_2._8_4_) {
LAB_00123586:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x40);
        std::runtime_error::runtime_error(this_00,"");
        *(undefined ***)this_00 = &PTR__system_error_0013b8a8;
        *(ulong *)(this_00 + 0x10) = CONCAT44(header.field_2._12_4_,header.field_2._8_4_);
        *(undefined8 *)(this_00 + 0x18) = ec._0_8_;
        *(runtime_error **)(this_00 + 0x20) = this_00 + 0x30;
        *(undefined8 *)(this_00 + 0x28) = 0;
        this_00[0x30] = (runtime_error)0x0;
        __cxa_throw(this_00,&boost::system::system_error::typeinfo,
                    boost::system::system_error::~system_error);
      }
      bVar2 = *(long *)(ec._0_8_ + 8) != *(long *)(local_c0 + 8);
      if (*(long *)(local_c0 + 8) == 0) {
        bVar2 = ec._0_8_ != local_c0;
      }
      if (bVar2) goto LAB_00123586;
      if ((size_type *)_auStack_60 != &header._M_string_length) {
        operator_delete(_auStack_60);
      }
      iVar4 = 0;
      bVar2 = true;
    }
    else {
LAB_001232ce:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Invalid response",0x10);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      iVar4 = -1;
      bVar2 = false;
    }
    if ((size_type *)
        response.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != &status_message._M_string_length) {
      operator_delete(response.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (context.init_.ref_.
        super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&http_version._M_string_length) {
      operator_delete(context.init_.ref_.
                      super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi);
    }
    http_version.field_2._8_8_ = _VTT;
    *(undefined8 *)((long)&http_version.field_2 + *(long *)(_VTT + -0x18) + 8) = _typeinfo;
    std::ios_base::~ios_base(local_1f0);
    boost::asio::basic_streambuf<std::allocator<char>_>::~basic_streambuf
              ((basic_streambuf<std::allocator<char>_> *)auStack_2b8);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if ((size_type *)query.host_name_.field_2._8_8_ != &query.service_name_._M_string_length) {
    operator_delete((void *)query.host_name_.field_2._8_8_);
  }
  if (query.hints_.ai_next != (addrinfo *)&query.host_name_._M_string_length) {
    operator_delete(query.hints_.ai_next);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)((long)&query.service_name_.field_2 + 8));
  boost::asio::ssl::detail::stream_core::~stream_core
            ((stream_core *)
             &socket.next_layer_.
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_698);
  plVar10 = *(long **)(server.field_2._8_8_ + 0x38);
  uVar9 = server.field_2._8_8_;
  if (plVar10 != (long *)0x0) {
    do {
      (**(code **)(*plVar10 + 0x10))(plVar10);
      uVar9 = server.field_2._8_8_;
      plVar10 = (long *)plVar10[4];
    } while (plVar10 != (long *)0x0);
    plVar10 = *(long **)(server.field_2._8_8_ + 0x38);
    if (plVar10 != (long *)0x0) {
      do {
        lVar1 = *plVar10;
        plVar10 = (long *)plVar10[4];
        (**(code **)(lVar1 + 8))();
        *(long **)(uVar9 + 0x38) = plVar10;
      } while (plVar10 != (long *)0x0);
      uVar9 = server.field_2._8_8_;
      if (server.field_2._8_8_ == 0) {
        uVar9 = (void *)0x0;
        goto LAB_001230b0;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)(uVar9 + 8));
LAB_001230b0:
  operator_delete((void *)uVar9);
  boost::asio::ssl::context::~context((context *)((long)&status_message.field_2 + 8));
  std::ios_base::~ios_base((ios_base *)&request_stream);
  local_330 = (undefined1  [8])&PTR__basic_streambuf_0013bf08;
  if (request.max_size_ != 0) {
    operator_delete((void *)request.max_size_);
  }
  local_330 = (undefined1  [8])__assert_fail;
  std::locale::~locale((locale *)&request.field_0x30);
  if (local_b8 != &parameters._M_string_length) {
    operator_delete(local_b8);
  }
  if (local_e8 != &path._M_string_length) {
    operator_delete(local_e8);
  }
  if ((size_type *)parameters.field_2._8_8_ != &server._M_string_length) {
    operator_delete((void *)parameters.field_2._8_8_);
  }
  if (bVar2) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {

  try {

    // Define server and path
    std::string const server = "www.instagram.com";
    std::string const path = "/accounts/login/ajax/";
    std::string const parameters = "username=fewfw&password=fewfw";

    //while (1) {

      // Define request
      boost::asio::streambuf request;
      std::ostream request_stream(&request);
      request_stream << "POST " << path << " HTTP/1.1\r\n";
      request_stream << "Host: " << server << "\r\n";
      // User-Agent is not mandatory
      request_stream << "Accept: */*\r\n";
      // Accept-Language is not mandatory
      // Accept-Encoding is not mandatory
      request_stream << "X-CSRFToken: fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY\r\n";
      // Content-Type is not mandatory
      // X-Requested-With is not mandatory
      request_stream << "Referer: https://" << server << "/\r\n";
      request_stream << "Content-Length: " << parameters.size() << "\r\n";
      request_stream
        << "Cookie: csrftoken=fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY; mid=V-I19wAEAAG8pOV3FUjiNYJVw2Z-; ig_pr=2; ig_vw=1440\r\n";
      request_stream << "Connection: close\r\n\r\n";
      request_stream << parameters;

      // Create ssl context
      boost::asio::ssl::context context(boost::asio::ssl::context::sslv23);
      context.set_default_verify_paths();

      // Create io_service
      boost::asio::io_service io_service;

      // Create the boost system error code
      boost::system::error_code ec;

      // Creatre socket
      boost::asio::ssl::stream<boost::asio::ip::tcp::socket> socket(
          io_service,
          context);

      // Get a list of endpoints corresponding to the server name
      boost::asio::ip::tcp::resolver resolver(io_service);
      boost::asio::ip::tcp::resolver::query query(server, "https");
      boost::asio::ip::tcp::resolver::iterator endpoint_iterator = resolver
          .resolve(query, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Resolve OK" << std::endl;

      // Set the peer verification mode
      socket.set_verify_mode(boost::asio::ssl::verify_peer, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }

      // Set the callback used to verify peer certificates
      socket.set_verify_callback(boost::bind(verify_certificate, _1, _2), ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }

      // Try each endpoint until we successfully establish a connection
      boost::asio::connect(socket.lowest_layer(), endpoint_iterator, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Connect OK" << std::endl;

      // Perform SSL handshaking
      socket.handshake(boost::asio::ssl::stream_base::client, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Handshake OK" << std::endl;

      // Print the request
      std::cout
        << "Print request:"
        << "\n****************************************\n"
        << boost::asio::buffer_cast<const char*>(request.data())
        << "\n****************************************"
        << std::endl;

      // Send the request
      boost::asio::write(socket, request, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Write OK" << std::endl;

      // Read the response status line. The response streambuf will automatically
      // grow to accommodate the entire line. The growth may be limited by passing
      // a maximum size to the streambuf constructor.
      boost::asio::streambuf response;
      boost::asio::read_until(socket, response, "\r\n");

      // Check that response is OK
      std::istream response_stream(&response);
      std::string http_version;
      response_stream >> http_version;
      unsigned int status_code;
      response_stream >> status_code;
      std::string status_message;
      std::getline(response_stream, status_message);
      if (!response_stream || http_version.substr(0, 5) != "HTTP/") {
        std::cout << "Invalid response" << std::endl;
        return -1;
      }

      // Print the response status code
      std::cout
        << "Response returned with status code "
        << status_code
        << std::endl;

      // Read the response headers, which are terminated by a blank line
      boost::asio::read_until(socket, response, "\r\n\r\n");

      // Process the response headers
      std::string header;
      while (std::getline(response_stream, header) && header != "\r") {
        std::cout << header << std::endl;
      }
      std::cout << std::endl;

      // Write whatever content we already have to output
      if (response.size() > 0) {
        std::cout << &response;
      }

      // Read until EOF, writing data to output as we go
      while (boost::asio::read(
          socket,
          response,
          boost::asio::transfer_at_least(1),
          ec)) {
        std::cout << &response;
      }
      std::cout << std::endl;
      if (ec != boost::asio::error::eof) {
        throw boost::system::system_error(ec);
      }

    //}

  } catch (std::exception& e) {
    std::cout << "Exception: " << e.what() << std::endl;
  }

  return 0;
}